

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_test.cpp
# Opt level: O0

void __thiscall skip_this_test::test_method(skip_this_test *this)

{
  long *plVar1;
  bool bVar2;
  undefined8 uVar3;
  lazy_ostream *prev;
  basic_cstring<const_char> local_a8;
  basic_cstring<const_char> local_98 [2];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_78;
  assertion_result local_58;
  basic_cstring<const_char> local_40;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  skip_this_test *local_10;
  skip_this_test *this_local;
  
  plVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_10 = this;
  uVar3 = boost::unit_test::framework::current_test_case();
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_20,"This test is ignored");
  (**(code **)(*plVar1 + 0x28))(plVar1,uVar3,&local_20);
  do {
    plVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zaufi[P]teamcity-cpp/boost/boost_test.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_40);
    boost::unit_test::unit_test_log_t::set_checkpoint(plVar1,&local_30,0x7a,&local_40);
    boost::test_tools::assertion_result::assertion_result(&local_58,true);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(local_98,"true",4);
    boost::unit_test::operator<<(&local_78,prev,local_98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zaufi[P]teamcity-cpp/boost/boost_test.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_58,&local_78,&local_a8,0x7a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_78);
    boost::test_tools::assertion_result::~assertion_result(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(skip_this_test)
{
    boost::unit_test::unit_test_log.test_unit_skipped(
        boost::unit_test_framework::framework::current_test_case()
#if BOOST_VERSION >= 105900
      , "This test is ignored"
#endif                                                      // BOOST_VERSION >= 105900
      );
    BOOST_CHECK(true);
}